

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

ASN1_INTEGER * s2i_ASN1_INTEGER(X509V3_EXT_METHOD *meth,char *value)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  X509V3_EXT_METHOD *pXVar4;
  bool bVar5;
  int local_3c;
  int ret;
  int ishex;
  int isneg;
  ASN1_INTEGER *aint;
  BIGNUM *bn;
  char *value_local;
  X509V3_EXT_METHOD *method_local;
  
  aint = (ASN1_INTEGER *)0x0;
  bn = (BIGNUM *)value;
  value_local = (char *)meth;
  if (value == (char *)0x0) {
    ERR_put_error(0x14,0,0x7e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_utl.cc"
                  ,0xb7);
    method_local = (X509V3_EXT_METHOD *)0x0;
  }
  else {
    aint = (ASN1_INTEGER *)BN_new();
    bVar5 = *(char *)&bn->d == '-';
    if (bVar5) {
      bn = (BIGNUM *)((long)&bn->d + 1);
    }
    if ((*(char *)&bn->d == '0') &&
       ((*(char *)((long)&bn->d + 1) == 'x' || (*(char *)((long)&bn->d + 1) == 'X')))) {
      bn = (BIGNUM *)((long)&bn->d + 2);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    if (bVar1) {
      local_3c = BN_hex2bn((BIGNUM **)&aint,(char *)bn);
    }
    else {
      sVar3 = strlen((char *)bn);
      if (0x2000 < sVar3) {
        BN_free((BIGNUM *)aint);
        ERR_put_error(0x14,0,0x7f,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_utl.cc"
                      ,0xd3);
        return (ASN1_INTEGER *)0x0;
      }
      local_3c = BN_dec2bn((BIGNUM **)&aint,(char *)bn);
    }
    if ((local_3c == 0) || (*(char *)((long)&bn->d + (long)local_3c) != '\0')) {
      BN_free((BIGNUM *)aint);
      ERR_put_error(0x14,0,0x66,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_utl.cc"
                    ,0xdb);
      method_local = (X509V3_EXT_METHOD *)0x0;
    }
    else {
      if ((bVar5) && (iVar2 = BN_is_zero((BIGNUM *)aint), iVar2 != 0)) {
        bVar5 = false;
      }
      pXVar4 = (X509V3_EXT_METHOD *)BN_to_ASN1_INTEGER((BIGNUM *)aint,(ASN1_INTEGER *)0x0);
      BN_free((BIGNUM *)aint);
      if (pXVar4 == (X509V3_EXT_METHOD *)0x0) {
        ERR_put_error(0x14,0,0x67,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_utl.cc"
                      ,0xe6);
        method_local = (X509V3_EXT_METHOD *)0x0;
      }
      else {
        method_local = pXVar4;
        if (bVar5) {
          pXVar4->ext_flags = pXVar4->ext_flags | 0x100;
        }
      }
    }
  }
  return (ASN1_INTEGER *)method_local;
}

Assistant:

ASN1_INTEGER *s2i_ASN1_INTEGER(const X509V3_EXT_METHOD *method,
                               const char *value) {
  BIGNUM *bn = NULL;
  ASN1_INTEGER *aint;
  int isneg, ishex;
  int ret;
  if (!value) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_NULL_VALUE);
    return 0;
  }
  bn = BN_new();
  if (value[0] == '-') {
    value++;
    isneg = 1;
  } else {
    isneg = 0;
  }

  if (value[0] == '0' && ((value[1] == 'x') || (value[1] == 'X'))) {
    value += 2;
    ishex = 1;
  } else {
    ishex = 0;
  }

  if (ishex) {
    ret = BN_hex2bn(&bn, value);
  } else {
    // Decoding from decimal scales quadratically in the input length. Bound the
    // largest decimal input we accept in the config parser. 8,192 decimal
    // digits allows values up to 27,213 bits. Ths exceeds the largest RSA, DSA,
    // or DH modulus we support, and those are not usefully represented in
    // decimal.
    if (strlen(value) > 8192) {
      BN_free(bn);
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_NUMBER);
      return 0;
    }
    ret = BN_dec2bn(&bn, value);
  }

  if (!ret || value[ret]) {
    BN_free(bn);
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_BN_DEC2BN_ERROR);
    return 0;
  }

  if (isneg && BN_is_zero(bn)) {
    isneg = 0;
  }

  aint = BN_to_ASN1_INTEGER(bn, NULL);
  BN_free(bn);
  if (!aint) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_BN_TO_ASN1_INTEGER_ERROR);
    return 0;
  }
  if (isneg) {
    aint->type |= V_ASN1_NEG;
  }
  return aint;
}